

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDivConstant.cpp
# Opt level: O2

void TPZShapeHDivConstant<pzshape::TPZShapeCube>::Initialize
               (TPZVec<long> *ids,TPZVec<int> *connectorders,TPZVec<int> *sideorient,
               TPZShapeData *data)

{
  int *piVar1;
  long lVar2;
  int local_94;
  TPZManVector<int,_15> locconorders;
  
  TPZManVector<int,_20>::TPZManVector((TPZManVector<int,_20> *)&locconorders,sideorient);
  TPZManVector<int,_20>::operator=(&data->fSideOrient,(TPZManVector<int,_20> *)&locconorders);
  TPZManVector<int,_20>::~TPZManVector((TPZManVector<int,_20> *)&locconorders);
  TPZManVector<int,_27>::Resize(&data->fHDivConnectOrders,7);
  TPZManVector<int,_27>::Resize(&data->fHDivNumConnectShape,7);
  local_94 = 1;
  TPZManVector<int,_15>::TPZManVector(&locconorders,0x13,&local_94);
  piVar1 = connectorders->fStore;
  for (lVar2 = 0; lVar2 != 7; lVar2 = lVar2 + 1) {
    locconorders.super_TPZVec<int>.fStore[lVar2 + 0xc] = piVar1[lVar2];
  }
  TPZShapeHCurlNoGrads<pzshape::TPZShapeCube>::Initialize(ids,&locconorders.super_TPZVec<int>,data);
  TPZManVector<int,_15>::~TPZManVector(&locconorders);
  return;
}

Assistant:

void TPZShapeHDivConstant<TSHAPE>::Initialize(TPZVec<int64_t> &ids,
                TPZVec<int> &connectorders,
                const TPZVec<int>& sideorient, 
                TPZShapeData &data)
{
    data.fSideOrient = sideorient;
    data.fHDivConnectOrders.Resize(TSHAPE::NFacets+1);
    data.fHDivNumConnectShape.Resize(TSHAPE::NFacets+1);
    if(TSHAPE::Dimension == 2)
    {
        //Compatibilize the polynomial order
        int conSize = connectorders.size();
        for (int i = 0; i < conSize; i++){
            connectorders[i]++;
        }
        if (TSHAPE::Type() == ETriangle){
            connectorders[conSize-1]++;
        }
        //Initialize data structures
        TPZShapeH1<TSHAPE>::Initialize(ids,connectorders,data);

        for(int ic = 0; ic<TSHAPE::NFacets;ic++)
        {
            data.fHDivConnectOrders[ic] =  connectorders[ic];
            data.fHDivNumConnectShape[ic] = data.fH1NumConnectShape[ic]+1;
        }
        int ic = TSHAPE::NFacets;
        data.fHDivConnectOrders[ic] =  connectorders[ic];
        data.fHDivNumConnectShape[ic] = data.fH1NumConnectShape[ic];
    }
    else
    {
        //Compatibilize the polynomial order
        if (TSHAPE::Type() == ETetraedro) {
            int conSize = connectorders.size();
            for (int i = 0; i < conSize; i++){
                connectorders[i]++;
            }
            connectorders[conSize-1]++;
        }

        const int nedges = TSHAPE::NSides-TSHAPE::NFacets-TSHAPE::NCornerNodes-1;
        TPZManVector<int,15> locconorders(TSHAPE::NSides-TSHAPE::NCornerNodes,1);
        for(int ic = nedges; ic<TSHAPE::NSides-TSHAPE::NCornerNodes; ic++)
        {
            locconorders[ic] = connectorders[ic-nedges];
        }
        TPZShapeHCurlNoGrads<TSHAPE>::Initialize(ids, locconorders, data);
//        TPZManVector<int> HCurlNumConnectShapeF = data.fHDivNumConnectShape;
//        data.fHDivNumConnectShape.Resize(TSHAPE::NFacets+1);
//        for(int ic=nedges; ic<TSHAPE::NSides-TSHAPE::NCornerNodes-1; ic++)
//        {
//            int numshape = HCurlNumConnectShapeF[ic]+1;
//            data.fHDivNumConnectShape[ic-nedges] = numshape;
//        }
//        int ic = TSHAPE::NSides-TSHAPE::NCornerNodes-1;
//        int numshape = HCurlNumConnectShapeF[ic];
//        data.fHDivNumConnectShape[ic-nedges] = numshape;
    }
}